

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void __thiscall IrSim::optimizeAssign(IrSim *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer pcVar5;
  _Alloc_hider _Var6;
  undefined1 *__s2;
  size_t __n;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  pointer pIVar11;
  uint uVar12;
  ulong uVar13;
  InterCode *pIVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  string *psVar18;
  string val;
  string right;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->isOpted = false;
  uVar9 = (int)((long)(this->edges).
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->edges).
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  if (0 < (int)uVar9) {
    uVar10 = 0;
    do {
      piVar4 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar4[uVar10];
      lVar17 = (long)iVar1;
      iVar2 = piVar4[uVar10 + 1];
      if (iVar1 < iVar2) {
        do {
          pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl
                    .super__Vector_impl_data._M_start;
          iVar1 = pIVar11[lVar17].kind;
          pIVar14 = pIVar11 + lVar17;
          if (iVar1 == 5) {
            uVar3 = (pIVar14->target).active;
            uVar12 = uVar3;
            if (*(pIVar14->target).value._M_dataplus._M_p == 'v') {
              uVar12 = 0xffffffff;
            }
            if (0 < (int)uVar12) {
              local_78 = local_68;
              pcVar5 = (pIVar14->target).value._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_78,pcVar5,
                         pcVar5 + (pIVar14->target).value._M_string_length);
              pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_50[0] = local_40;
              _Var6._M_p = pIVar11[lVar17].arg1.value._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_50,_Var6._M_p,
                         _Var6._M_p + pIVar11[lVar17].arg1.value._M_string_length);
              uVar12 = uVar3;
              if (0 < (int)uVar3) {
                pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                iVar1 = pIVar11[lVar17].arg1.kind;
                do {
                  __n = local_70;
                  __s2 = local_78;
                  uVar13 = (ulong)uVar3;
                  local_58 = uVar13 * 0x98;
                  iVar16 = 3;
                  while( true ) {
                    lVar15 = 8;
                    if (iVar16 == 1) {
                      lVar15 = 0x68;
                    }
                    if (iVar16 == 2) {
                      lVar15 = 0x38;
                    }
                    if ((*(size_t *)((long)&pIVar11[uVar13].target.value._M_dataplus + lVar15) ==
                         __n) && ((psVar18 = (string *)((long)&pIVar11[uVar13].target.kind + lVar15)
                                  , __n == 0 ||
                                  (iVar8 = bcmp(*(void **)psVar18,__s2,__n), iVar8 == 0)))) break;
                    iVar16 = iVar16 + -1;
                    if (iVar16 == 0) goto LAB_001092d4;
                  }
                  this->isOpted = true;
                  std::__cxx11::string::_M_assign(psVar18);
                  pIVar14 = (InterCode *)
                            ((long)&((this->irList).
                                     super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->kind + local_58);
                  *(int *)((long)&pIVar14->kind + lVar15) = iVar1;
                  uVar3 = *(uint *)((long)&(pIVar14->target).value.field_2 + lVar15 + 8);
                  InterCode::doArith(pIVar14);
                  pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  *(undefined4 *)((long)&pIVar11[(int)uVar3].target.value.field_2 + lVar15 + 8U) = 0
                  ;
                  if (iVar16 == 0) {
LAB_001092d4:
                    uVar12 = 0xffffffff;
                    break;
                  }
                  uVar12 = uVar3;
                } while (0 < (int)uVar3);
              }
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
              if (local_78 != local_68) {
                operator_delete(local_78);
              }
            }
            if ((uVar12 == 0) &&
               (bVar7 = canDisable(this,&(this->irList).
                                         super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                         _M_impl.super__Vector_impl_data._M_start[lVar17].target.
                                         value,(int)uVar10), bVar7)) {
              pIVar11 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pIVar11[lVar17].kind = 0;
              pIVar11[lVar17].target.kind = 0;
              pIVar11[lVar17].target.value._M_string_length = 0;
              *pIVar11[lVar17].target.value._M_dataplus._M_p = '\0';
              pIVar11[lVar17].arg1.kind = 0;
              pIVar11[lVar17].arg1.value._M_string_length = 0;
              *pIVar11[lVar17].arg1.value._M_dataplus._M_p = '\0';
              pIVar11[lVar17].arg2.kind = 0;
              pIVar11[lVar17].arg2.value._M_string_length = 0;
              *pIVar11[lVar17].arg2.value._M_dataplus._M_p = '\0';
              goto LAB_0010937e;
            }
          }
          else if ((iVar1 - 1U < 5) && (bVar7 = InterCode::doArith(pIVar14), bVar7)) {
LAB_0010937e:
            this->isOpted = true;
          }
          lVar17 = lVar17 + 1;
        } while (iVar2 != (int)lVar17);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uVar9 & 0x7fffffff));
  }
  return;
}

Assistant:

void IrSim::optimizeAssign() {
    isOpted = false;
    int size = (int)edges.size();
    for (int i = 0; i < size; ++i) {
        for (int k = (int) basicBlocks[i], j = (int) basicBlocks[i + 1] - 1; k <= j; ++k) {
            int kind = irList[k].kind;
            if (kind == IC_ASSIGN) {
                int m = irList[k].target.active;
                if (irList[k].target.value[0] == 'v')
                    m = -1;
                if (m > 0) {
                    string val = irList[k].target.value;
                    string right = irList[k].arg1.value;
                    kind = irList[k].arg1.kind;
                    while (m > 0) {
                        int n = 0;
                        for (; n < 3; ++n) {
                            if (irList[m][n].value == val) {
                                isOpted = true;
                                irList[m][n].value = right;
                                irList[m][n].kind = kind;
                                int active = irList[m][n].active;
                                irList[m].doArith();
                                m = active;
                                irList[m][n].active = 0;
                                break;
                            }
                        }
                        if (n == 3) {
//                            cerr << "debug: index val != val (should not happen, ignore optimizing)" << endl;
                            m = -1;
                        }
                    }
                }
//                else if (irList[k].target.active != 0 && irList[k].target.value[0] != 'v') {
//                    cerr << "debug: target < 0 (should not happen, ignore optimizing)" << endl;
//                }
                if (m == 0 && canDisable(irList[k].target.value, i)) {
                    irList[k].disable();
                    isOpted = true;
                }
            }
            else if (kind >= IC_ADD && kind <= IC_ASSIGN) {
                if (irList[k].doArith())
                    isOpted = true;
            }
        }
    }
}